

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall
CConnman::BindListenPort
          (CConnman *this,CService *addrBind,bilingual_str *strError,NetPermissionFlags permissions)

{
  ConstevalFormatString<1U> fmt;
  ConstevalFormatString<1U> fmt_00;
  ConstevalFormatString<1U> fmt_01;
  ConstevalFormatString<1U> fmt_02;
  ConstevalFormatString<1U> fmt_03;
  ConstevalFormatString<1U> fmt_04;
  ConstevalFormatString<1U> fmt_05;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer pSVar4;
  int *piVar5;
  bilingual_str *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  int nErr;
  unique_ptr<Sock,_std::default_delete<Sock>_> sock;
  socklen_t len;
  int nOne;
  sockaddr_storage sockaddr;
  undefined4 in_stack_fffffffffffff838;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffff83c;
  bilingual_str *in_stack_fffffffffffff840;
  char *pcVar7;
  bilingual_str *in_stack_fffffffffffff848;
  function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)>
  *in_stack_fffffffffffff850;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff858;
  undefined2 in_stack_fffffffffffff860;
  undefined1 in_stack_fffffffffffff862;
  undefined1 in_stack_fffffffffffff863;
  int in_stack_fffffffffffff864;
  int in_stack_fffffffffffff868;
  int in_stack_fffffffffffff86c;
  CService *in_stack_fffffffffffff870;
  allocator<char> *in_stack_fffffffffffff878;
  allocator<char> *paVar8;
  undefined4 in_stack_fffffffffffff880;
  undefined4 in_stack_fffffffffffff884;
  ConstevalStringLiteral in_stack_fffffffffffff888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff890;
  undefined4 in_stack_fffffffffffff898;
  undefined4 in_stack_fffffffffffff89c;
  LogFlags in_stack_fffffffffffff8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8a8;
  int source_line;
  bilingual_str *in_stack_fffffffffffff8b8;
  undefined4 in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8ec;
  char *in_stack_fffffffffffff8f0;
  char *in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff904;
  char *in_stack_fffffffffffff908;
  bool local_6b9;
  allocator<char> local_631 [17];
  Level in_stack_fffffffffffff9e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f0;
  allocator<char> local_5e1 [44];
  allocator<char> local_5b5;
  uint local_5b4;
  undefined4 local_5b0 [42];
  bilingual_str local_508 [8];
  CService local_308 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248 [14];
  undefined1 local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_5b0[0] = 1;
  local_5b4 = 0x80;
  bVar1 = CService::GetSockAddr
                    ((CService *)
                     CONCAT44(in_stack_fffffffffffff864,
                              CONCAT13(in_stack_fffffffffffff863,
                                       CONCAT12(in_stack_fffffffffffff862,in_stack_fffffffffffff860)
                                      )),(sockaddr *)in_stack_fffffffffffff858,
                     (socklen_t *)in_stack_fffffffffffff850);
  if (bVar1) {
    CService::GetSAFamily((CService *)in_stack_fffffffffffff840);
    std::function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)>::operator()
              (in_stack_fffffffffffff850,in_stack_fffffffffffff86c,in_stack_fffffffffffff868,
               in_stack_fffffffffffff864);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                       CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
    if (bVar1) {
      pSVar4 = std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator->
                         ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                          CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
      iVar2 = (*pSVar4->_vptr_Sock[10])(pSVar4,1,2,local_5b0,4);
      if (iVar2 == -1) {
        in_stack_fffffffffffff890 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffff9f7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff888.lit,
                   (char *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                   in_stack_fffffffffffff878);
        Untranslated((string *)in_stack_fffffffffffff870);
        __errno_location();
        NetworkErrorString_abi_cxx11_((int)((ulong)in_stack_fffffffffffff840 >> 0x20));
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)CONCAT44(in_stack_fffffffffffff89c,iVar2),
                   in_stack_fffffffffffff890);
        in_stack_fffffffffffff888.lit = (char *)local_248;
        bilingual_str::operator=(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
        bilingual_str::~bilingual_str
                  ((bilingual_str *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
        bilingual_str::~bilingual_str
                  ((bilingual_str *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff9f7);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
        in_stack_fffffffffffff8f8 = "%s\n";
        in_stack_fffffffffffff840 = (bilingual_str *)0x1eb437c;
        in_stack_fffffffffffff838 = 2;
        logging_function_01._M_len._4_4_ = in_stack_fffffffffffff904;
        logging_function_01._M_len._0_4_ = in_stack_fffffffffffff900;
        logging_function_01._M_str = in_stack_fffffffffffff908;
        source_file_01._M_str = "%s\n";
        source_file_01._M_len = (size_t)in_stack_fffffffffffff8f0;
        fmt_01.fmt._4_4_ = in_stack_fffffffffffff8ec;
        fmt_01.fmt._0_4_ = in_stack_fffffffffffff8e8;
        in_stack_fffffffffffff848 = in_RDX;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_01,source_file_01,
                   (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),in_stack_fffffffffffff8a0,
                   in_stack_fffffffffffff9e0,fmt_01,in_stack_fffffffffffff9f0);
      }
      bVar1 = CNetAddr::IsIPv6((CNetAddr *)
                               CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
      uVar6 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff884);
      if (bVar1) {
        pSVar4 = std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator->
                           ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                            CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
        iVar3 = (*pSVar4->_vptr_Sock[10])(pSVar4,0x29,0x1a,local_5b0,4);
        if (iVar3 == -1) {
          paVar8 = local_631;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff888.lit,(char *)CONCAT44(uVar6,iVar3),paVar8);
          Untranslated((string *)in_stack_fffffffffffff870);
          __errno_location();
          NetworkErrorString_abi_cxx11_((int)((ulong)in_stack_fffffffffffff840 >> 0x20));
          tinyformat::format<std::__cxx11::string>
                    ((bilingual_str *)CONCAT44(in_stack_fffffffffffff89c,iVar2),
                     in_stack_fffffffffffff890);
          in_stack_fffffffffffff870 = local_308;
          bilingual_str::operator=(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838))
          ;
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838))
          ;
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
          std::allocator<char>::~allocator(local_631);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
          in_stack_fffffffffffff8f0 = "%s\n";
          in_stack_fffffffffffff840 = (bilingual_str *)0x1eb437c;
          in_stack_fffffffffffff838 = 2;
          logging_function_02._M_len._4_4_ = in_stack_fffffffffffff904;
          logging_function_02._M_len._0_4_ = in_stack_fffffffffffff900;
          logging_function_02._M_str = in_stack_fffffffffffff908;
          source_file_02._M_str = in_stack_fffffffffffff8f8;
          source_file_02._M_len = (size_t)"%s\n";
          fmt_02.fmt._4_4_ = in_stack_fffffffffffff8ec;
          fmt_02.fmt._0_4_ = in_stack_fffffffffffff8e8;
          in_stack_fffffffffffff848 = in_RDX;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function_02,source_file_02,
                     (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),in_stack_fffffffffffff8a0,
                     in_stack_fffffffffffff9e0,fmt_02,in_stack_fffffffffffff9f0);
        }
      }
      pSVar4 = std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator->
                         ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                          CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
      iVar3 = (*pSVar4->_vptr_Sock[6])(pSVar4,local_88,(ulong)local_5b4);
      if (iVar3 == -1) {
        piVar5 = __errno_location();
        iVar2 = *piVar5;
        if (iVar2 == 0x62) {
          ::_(in_stack_fffffffffffff888);
          CService::ToStringAddrPort_abi_cxx11_(in_stack_fffffffffffff870);
          tinyformat::format<std::__cxx11::string,char[13]>
                    (in_stack_fffffffffffff8b8,in_RDI,(char (*) [13])in_stack_fffffffffffff8a8);
          iVar3 = (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20);
          bilingual_str::operator=(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838))
          ;
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838))
          ;
        }
        else {
          ::_(in_stack_fffffffffffff888);
          CService::ToStringAddrPort_abi_cxx11_(in_stack_fffffffffffff870);
          NetworkErrorString_abi_cxx11_((int)((ulong)in_stack_fffffffffffff840 >> 0x20));
          tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                    (in_stack_fffffffffffff8b8,in_RDI,in_stack_fffffffffffff8a8);
          iVar3 = (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20);
          bilingual_str::operator=(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838))
          ;
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838))
          ;
        }
        bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
                                    Trace);
        if (bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
          logging_function_03._M_len._4_4_ = in_stack_fffffffffffff904;
          logging_function_03._M_len._0_4_ = in_stack_fffffffffffff900;
          logging_function_03._M_str = in_stack_fffffffffffff908;
          source_file_03._M_str = in_stack_fffffffffffff8f8;
          source_file_03._M_len = (size_t)in_stack_fffffffffffff8f0;
          fmt_03.fmt._4_4_ = iVar2;
          fmt_03.fmt._0_4_ = in_stack_fffffffffffff8e8;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function_03,source_file_03,iVar3,in_stack_fffffffffffff8a0,
                     in_stack_fffffffffffff9e0,fmt_03,in_stack_fffffffffffff9f0);
          in_stack_fffffffffffff848 = in_RDX;
        }
        local_6b9 = false;
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
        source_line = (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
        CService::ToStringAddrPort_abi_cxx11_(in_stack_fffffffffffff870);
        in_stack_fffffffffffff848 = local_508;
        pcVar7 = "Bound to %s\n";
        uVar6 = 2;
        logging_function_04._M_len._4_4_ = in_stack_fffffffffffff904;
        logging_function_04._M_len._0_4_ = in_stack_fffffffffffff900;
        logging_function_04._M_str = in_stack_fffffffffffff908;
        source_file_04._M_str = in_stack_fffffffffffff8f8;
        source_file_04._M_len = (size_t)in_stack_fffffffffffff8f0;
        fmt_04.fmt._4_4_ = in_stack_fffffffffffff8ec;
        fmt_04.fmt._0_4_ = in_stack_fffffffffffff8e8;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_04,source_file_04,source_line,in_stack_fffffffffffff8a0,
                   in_stack_fffffffffffff9e0,fmt_04,in_stack_fffffffffffff9f0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff83c,uVar6));
        pSVar4 = std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator->
                           ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                            CONCAT44(in_stack_fffffffffffff83c,uVar6));
        iVar3 = (*pSVar4->_vptr_Sock[7])(pSVar4,0x1000);
        if (iVar3 == -1) {
          ::_(in_stack_fffffffffffff888);
          __errno_location();
          NetworkErrorString_abi_cxx11_((int)((ulong)pcVar7 >> 0x20));
          tinyformat::format<std::__cxx11::string>
                    ((bilingual_str *)CONCAT44(in_stack_fffffffffffff89c,iVar2),
                     in_stack_fffffffffffff890);
          bilingual_str::operator=(in_stack_fffffffffffff848,(bilingual_str *)pcVar7);
          bilingual_str::~bilingual_str((bilingual_str *)CONCAT44(in_stack_fffffffffffff83c,uVar6));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff83c,uVar6));
          bilingual_str::~bilingual_str((bilingual_str *)CONCAT44(in_stack_fffffffffffff83c,uVar6));
          bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff83c,uVar6),Trace);
          if (bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
            logging_function_05._M_len._4_4_ = in_stack_fffffffffffff904;
            logging_function_05._M_len._0_4_ = in_stack_fffffffffffff900;
            logging_function_05._M_str = in_stack_fffffffffffff908;
            source_file_05._M_str = in_stack_fffffffffffff8f8;
            source_file_05._M_len = (size_t)in_stack_fffffffffffff8f0;
            fmt_05.fmt._4_4_ = in_stack_fffffffffffff8ec;
            fmt_05.fmt._0_4_ = in_stack_fffffffffffff8e8;
            LogPrintFormatInternal<std::__cxx11::string>
                      (logging_function_05,source_file_05,source_line,in_stack_fffffffffffff8a0,
                       in_stack_fffffffffffff9e0,fmt_05,in_stack_fffffffffffff9f0);
            in_stack_fffffffffffff848 = in_RDX;
          }
          local_6b9 = false;
        }
        else {
          std::vector<CConnman::ListenSocket,std::allocator<CConnman::ListenSocket>>::
          emplace_back<std::unique_ptr<Sock,std::default_delete<Sock>>,NetPermissionFlags&>
                    ((vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_> *)
                     in_stack_fffffffffffff858,
                     (unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffff850,
                     (NetPermissionFlags *)in_stack_fffffffffffff848);
          local_6b9 = true;
        }
      }
    }
    else {
      paVar8 = local_5e1;
      std::allocator<char>::allocator();
      iVar2 = (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff888.lit,
                 (char *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                 in_stack_fffffffffffff878);
      Untranslated((string *)in_stack_fffffffffffff870);
      __errno_location();
      NetworkErrorString_abi_cxx11_((int)((ulong)in_stack_fffffffffffff840 >> 0x20));
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                 in_stack_fffffffffffff890);
      bilingual_str::operator=(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
      std::allocator<char>::~allocator(local_5e1);
      bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
                                  Trace);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
        logging_function_00._M_len._4_4_ = in_stack_fffffffffffff904;
        logging_function_00._M_len._0_4_ = in_stack_fffffffffffff900;
        logging_function_00._M_str = "%s\n";
        source_file_00._M_str = in_stack_fffffffffffff8f8;
        source_file_00._M_len = (size_t)in_stack_fffffffffffff8f0;
        fmt_00.fmt._4_4_ = in_stack_fffffffffffff8ec;
        fmt_00.fmt._0_4_ = in_stack_fffffffffffff8e8;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_00,source_file_00,iVar2,(LogFlags)paVar8,
                   in_stack_fffffffffffff9e0,fmt_00,in_stack_fffffffffffff9f0);
        in_stack_fffffffffffff848 = in_RDX;
      }
      local_6b9 = false;
    }
    std::unique_ptr<Sock,_std::default_delete<Sock>_>::~unique_ptr
              ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffff848);
  }
  else {
    iVar2 = (int)((ulong)&local_5b5 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff888.lit,
               (char *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
               in_stack_fffffffffffff878);
    Untranslated((string *)in_stack_fffffffffffff870);
    CService::ToStringAddrPort_abi_cxx11_(in_stack_fffffffffffff870);
    tinyformat::format<std::__cxx11::string>
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
               in_stack_fffffffffffff890);
    bilingual_str::operator=(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
    std::allocator<char>::~allocator(&local_5b5);
    bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),Trace)
    ;
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850);
      logging_function._M_len._4_4_ = in_stack_fffffffffffff904;
      logging_function._M_len._0_4_ = in_stack_fffffffffffff900;
      logging_function._M_str = in_stack_fffffffffffff908;
      source_file._M_str = in_stack_fffffffffffff8f8;
      source_file._M_len = (size_t)in_stack_fffffffffffff8f0;
      fmt.fmt._4_4_ = in_stack_fffffffffffff8ec;
      fmt.fmt._0_4_ = in_stack_fffffffffffff8e8;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,iVar2,in_stack_fffffffffffff8a0,
                 in_stack_fffffffffffff9e0,fmt,in_stack_fffffffffffff9f0);
    }
    local_6b9 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_6b9;
}

Assistant:

bool CConnman::BindListenPort(const CService& addrBind, bilingual_str& strError, NetPermissionFlags permissions)
{
    int nOne = 1;

    // Create socket for listening for incoming connections
    struct sockaddr_storage sockaddr;
    socklen_t len = sizeof(sockaddr);
    if (!addrBind.GetSockAddr((struct sockaddr*)&sockaddr, &len))
    {
        strError = strprintf(Untranslated("Bind address family for %s not supported"), addrBind.ToStringAddrPort());
        LogPrintLevel(BCLog::NET, BCLog::Level::Error, "%s\n", strError.original);
        return false;
    }

    std::unique_ptr<Sock> sock = CreateSock(addrBind.GetSAFamily(), SOCK_STREAM, IPPROTO_TCP);
    if (!sock) {
        strError = strprintf(Untranslated("Couldn't open socket for incoming connections (socket returned error %s)"), NetworkErrorString(WSAGetLastError()));
        LogPrintLevel(BCLog::NET, BCLog::Level::Error, "%s\n", strError.original);
        return false;
    }

    // Allow binding if the port is still in TIME_WAIT state after
    // the program was closed and restarted.
    if (sock->SetSockOpt(SOL_SOCKET, SO_REUSEADDR, (sockopt_arg_type)&nOne, sizeof(int)) == SOCKET_ERROR) {
        strError = strprintf(Untranslated("Error setting SO_REUSEADDR on socket: %s, continuing anyway"), NetworkErrorString(WSAGetLastError()));
        LogPrintf("%s\n", strError.original);
    }

    // some systems don't have IPV6_V6ONLY but are always v6only; others do have the option
    // and enable it by default or not. Try to enable it, if possible.
    if (addrBind.IsIPv6()) {
#ifdef IPV6_V6ONLY
        if (sock->SetSockOpt(IPPROTO_IPV6, IPV6_V6ONLY, (sockopt_arg_type)&nOne, sizeof(int)) == SOCKET_ERROR) {
            strError = strprintf(Untranslated("Error setting IPV6_V6ONLY on socket: %s, continuing anyway"), NetworkErrorString(WSAGetLastError()));
            LogPrintf("%s\n", strError.original);
        }
#endif
#ifdef WIN32
        int nProtLevel = PROTECTION_LEVEL_UNRESTRICTED;
        if (sock->SetSockOpt(IPPROTO_IPV6, IPV6_PROTECTION_LEVEL, (const char*)&nProtLevel, sizeof(int)) == SOCKET_ERROR) {
            strError = strprintf(Untranslated("Error setting IPV6_PROTECTION_LEVEL on socket: %s, continuing anyway"), NetworkErrorString(WSAGetLastError()));
            LogPrintf("%s\n", strError.original);
        }
#endif
    }

    if (sock->Bind(reinterpret_cast<struct sockaddr*>(&sockaddr), len) == SOCKET_ERROR) {
        int nErr = WSAGetLastError();
        if (nErr == WSAEADDRINUSE)
            strError = strprintf(_("Unable to bind to %s on this computer. %s is probably already running."), addrBind.ToStringAddrPort(), PACKAGE_NAME);
        else
            strError = strprintf(_("Unable to bind to %s on this computer (bind returned error %s)"), addrBind.ToStringAddrPort(), NetworkErrorString(nErr));
        LogPrintLevel(BCLog::NET, BCLog::Level::Error, "%s\n", strError.original);
        return false;
    }
    LogPrintf("Bound to %s\n", addrBind.ToStringAddrPort());

    // Listen for incoming connections
    if (sock->Listen(SOMAXCONN) == SOCKET_ERROR)
    {
        strError = strprintf(_("Listening for incoming connections failed (listen returned error %s)"), NetworkErrorString(WSAGetLastError()));
        LogPrintLevel(BCLog::NET, BCLog::Level::Error, "%s\n", strError.original);
        return false;
    }

    vhListenSocket.emplace_back(std::move(sock), permissions);
    return true;
}